

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.h
# Opt level: O3

void __thiscall
Js::FunctionCodeGenJitTimeData::SetGlobalObjTypeSpecFldInfo
          (FunctionCodeGenJitTimeData *this,uint propertyInfoId,ObjTypeSpecFldInfo *info)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *pWVar4;
  
  pWVar4 = (this->globalObjTypeSpecFldInfoArray).ptr;
  if ((pWVar4 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) ||
     (this->globalObjTypeSpecFldInfoCount <= propertyInfoId)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.h"
                                ,0x99,
                                "(this->globalObjTypeSpecFldInfoArray != nullptr && propertyInfoId < this->globalObjTypeSpecFldInfoCount)"
                                ,
                                "this->globalObjTypeSpecFldInfoArray != nullptr && propertyInfoId < this->globalObjTypeSpecFldInfoCount"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pWVar4 = (this->globalObjTypeSpecFldInfoArray).ptr;
  }
  pWVar4 = pWVar4 + propertyInfoId;
  Memory::Recycler::WBSetBit((char *)pWVar4);
  pWVar4->ptr = info;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar4);
  return;
}

Assistant:

void SetGlobalObjTypeSpecFldInfo(uint propertyInfoId, ObjTypeSpecFldInfo* info) const
        {
            Assert(this->globalObjTypeSpecFldInfoArray != nullptr && propertyInfoId < this->globalObjTypeSpecFldInfoCount);
            this->globalObjTypeSpecFldInfoArray[propertyInfoId] = info;
        }